

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

void __thiscall
opengv::absolute_pose::modules::Epnp::relative_error
          (Epnp *this,double *rot_err,double *transl_err,double (*Rtrue) [3],double *ttrue,
          double (*Rest) [3],double *test)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double qest [4];
  double qtrue [4];
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  
  mat_to_quat(this,Rtrue,&local_58);
  mat_to_quat(this,Rest,&local_78);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_50;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_58;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_50 + local_70;
  auVar3 = vunpcklpd_avx(auVar9,auVar3);
  auVar4._0_8_ = auVar3._0_8_ * auVar3._0_8_;
  auVar4._8_8_ = auVar3._8_8_ * auVar3._8_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_58 - local_78;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (local_50 - local_70) * (local_50 - local_70);
  auVar3 = vfmadd231sd_fma(auVar14,auVar11,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_48;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_48 - local_68;
  auVar3 = vfmadd213sd_fma(auVar18,auVar18,auVar3);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_40;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_40 - local_60;
  auVar3 = vfmadd213sd_fma(auVar20,auVar20,auVar3);
  auVar2 = vsqrtsd_avx(auVar3,auVar3);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_58 + local_78;
  auVar3 = vunpcklpd_avx(auVar7,auVar1);
  auVar1 = vfmadd213pd_fma(auVar3,auVar3,auVar4);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_48 + local_68;
  auVar3 = vunpcklpd_avx(auVar17,auVar12);
  auVar1 = vfmadd213pd_fma(auVar3,auVar3,auVar1);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_60 + local_40;
  auVar3 = vunpcklpd_avx(auVar19,auVar15);
  auVar3 = vfmadd213pd_fma(auVar3,auVar3,auVar1);
  auVar3 = vsqrtpd_avx(auVar3);
  auVar2 = vunpcklpd_avx(auVar3,auVar2);
  auVar3 = vshufpd_avx(auVar3,auVar3,3);
  auVar3 = vdivpd_avx(auVar2,auVar3);
  auVar2 = vshufpd_avx(auVar3,auVar3,1);
  auVar3 = vminsd_avx(auVar3,auVar2);
  *rot_err = auVar3._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = ttrue[1];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *ttrue;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = ttrue[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = ttrue[1] - test[1];
  auVar3 = vunpcklpd_avx(auVar10,auVar5);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *ttrue - *test;
  auVar2 = vunpcklpd_avx(auVar8,auVar2);
  auVar6._0_8_ = auVar3._0_8_ * auVar3._0_8_;
  auVar6._8_8_ = auVar3._8_8_ * auVar3._8_8_;
  auVar2 = vfmadd213pd_fma(auVar2,auVar2,auVar6);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = ttrue[2] - test[2];
  auVar3 = vunpcklpd_avx(auVar16,auVar13);
  auVar3 = vfmadd213pd_fma(auVar3,auVar3,auVar2);
  auVar2 = vsqrtpd_avx(auVar3);
  auVar3 = vshufpd_avx(auVar2,auVar2,1);
  *transl_err = auVar2._0_8_ / auVar3._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::relative_error(
    double & rot_err,
    double & transl_err,
    const double Rtrue[3][3],
    const double ttrue[3],
    const double Rest[3][3],
    const double test[3])
{
  double qtrue[4], qest[4];

  mat_to_quat(Rtrue, qtrue);
  mat_to_quat(Rest, qest);

  double rot_err1 = sqrt((qtrue[0] - qest[0]) * (qtrue[0] - qest[0]) +
                         (qtrue[1] - qest[1]) * (qtrue[1] - qest[1]) +
                         (qtrue[2] - qest[2]) * (qtrue[2] - qest[2]) +
                         (qtrue[3] - qest[3]) * (qtrue[3] - qest[3])) /
                    sqrt(qtrue[0] * qtrue[0] +
                         qtrue[1] * qtrue[1] +
                         qtrue[2] * qtrue[2] +
                         qtrue[3] * qtrue[3]);

  double rot_err2 = sqrt((qtrue[0] + qest[0]) * (qtrue[0] + qest[0]) +
                         (qtrue[1] + qest[1]) * (qtrue[1] + qest[1]) +
                         (qtrue[2] + qest[2]) * (qtrue[2] + qest[2]) +
                         (qtrue[3] + qest[3]) * (qtrue[3] + qest[3]) ) /
                    sqrt(qtrue[0] * qtrue[0] +
                         qtrue[1] * qtrue[1] +
                         qtrue[2] * qtrue[2] +
                         qtrue[3] * qtrue[3]);

  rot_err = min(rot_err1,rot_err2);

  transl_err = sqrt((ttrue[0] - test[0]) * (ttrue[0] - test[0]) +
                    (ttrue[1] - test[1]) * (ttrue[1] - test[1]) +
                    (ttrue[2] - test[2]) * (ttrue[2] - test[2])) /
               sqrt(ttrue[0] * ttrue[0] +
                    ttrue[1] * ttrue[1] +
                    ttrue[2] * ttrue[2]);
}